

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_meta_type_list.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  bool local_40;
  bool local_3f;
  bool local_3e;
  bool local_3d;
  bool local_3c;
  bool local_3b;
  bool local_3a;
  bool local_39;
  bool local_38;
  bool local_37;
  bool local_36;
  bool local_35;
  bool local_34;
  bool local_33;
  bool local_32;
  bool local_31;
  bool local_30;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool local_28;
  bool local_27;
  bool local_26;
  bool local_25;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21;
  bool local_20;
  bool local_1f;
  bool local_1e;
  bool local_1d;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  bool local_18;
  bool local_17;
  bool local_16;
  bool local_15;
  bool local_14;
  bool local_13;
  bool local_12;
  bool local_11;
  bool local_10;
  bool local_f;
  bool local_e;
  bool local_d [5];
  
  local_d[1] = false;
  local_d[2] = false;
  local_d[3] = false;
  local_d[4] = false;
  local_d[0] = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x2a,"int main()",(bool *)&std::integral_constant<bool,true>::value,local_d);
  local_e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x2b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_e);
  local_f = true;
  local_10 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x3d,"int main()",&local_f,&local_10);
  local_11 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x3e,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_11);
  local_12 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x52,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_12);
  local_13 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x53,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_13);
  local_14 = true;
  local_15 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x67,"int main()",&local_14,&local_15);
  local_16 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x68,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_16);
  local_17 = true;
  local_18 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x7c,"int main()",&local_17,&local_18);
  local_19 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x7d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_19);
  local_1a = true;
  local_1b = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x91,"int main()",&local_1a,&local_1b);
  local_1c = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x92,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1c);
  local_1d = true;
  local_1e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xa6,"int main()",&local_1d,&local_1e);
  local_1f = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xa7,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1f);
  local_20 = true;
  local_21 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xbb,"int main()",&local_20,&local_21);
  local_22 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xbc,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_22);
  local_23 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xd0,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_23);
  local_24 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xd1,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_24);
  local_25 = true;
  local_26 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xe5,"int main()",&local_25,&local_26);
  local_27 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xe6,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_27);
  local_28 = true;
  local_29 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x107,"int main()",&local_28,&local_29);
  local_2a = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x108,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2a);
  local_2b = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x11a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2b);
  local_2c = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x129,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2c);
  local_2d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x139,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2d);
  local_2e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x149,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2e);
  local_2f = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x159,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2f);
  local_30 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x169,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_30);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x179,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x189,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_33 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x19a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_33);
  local_34 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1ab,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_34);
  local_35 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1bc,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_35);
  local_36 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1cc,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_36);
  local_37 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1d8,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_37);
  local_38 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1e4,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_38);
  local_39 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1f0,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_39);
  local_3a = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1fc,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_3a);
  local_3b = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x208,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_3b);
  local_3c = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x214,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_3c);
  local_3d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x220,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_3d);
  local_3e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x22c,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_3e);
  local_3f = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x238,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_3f);
  local_40 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x244,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_40);
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    // type_list_sort {{{
    
    { // 01 {{{ 

        using A = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 10 {{{

        using A = type_list<
            integral_constant<int, 1>
          , integral_constant<int, 0>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 012 {{{

        using A = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 021 {{{

        using A = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 2>
          , integral_constant<int, 1>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 102 {{{

        using A = type_list<
            integral_constant<int, 1>
          , integral_constant<int, 0>
          , integral_constant<int, 2>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 120 {{{

        using A = type_list<
            integral_constant<int, 1>
          , integral_constant<int, 2>
          , integral_constant<int, 0>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 201 {{{

        using A = type_list<
            integral_constant<int, 2>
          , integral_constant<int, 0>
          , integral_constant<int, 1>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 210 {{{

        using A = type_list<
            integral_constant<int, 2>
          , integral_constant<int, 1>
          , integral_constant<int, 0>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 139 {{{

        using A = type_list<
            integral_constant<int, 1>
          , integral_constant<int, 3>
          , integral_constant<int, 9>
        >;

        using B = type_list<
            integral_constant<int, 1>
          , integral_constant<int, 3>
          , integral_constant<int, 9>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 391 {{{

        using A = type_list<
            integral_constant<int, 3>
          , integral_constant<int, 9>
          , integral_constant<int, 1>
        >;

        using B = type_list<
            integral_constant<int, 1>
          , integral_constant<int, 3>
          , integral_constant<int, 9>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 9123547806 {{{
        using A = type_list<
            integral_constant<int, 9>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
          , integral_constant<int, 3>
          , integral_constant<int, 5>
          , integral_constant<int, 4>
          , integral_constant<int, 7>
          , integral_constant<int, 8>
          , integral_constant<int, 0>
          , integral_constant<int, 6>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
          , integral_constant<int, 3>
          , integral_constant<int, 4>
          , integral_constant<int, 5>
          , integral_constant<int, 6>
          , integral_constant<int, 7>
          , integral_constant<int, 8>
          , integral_constant<int, 9>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);
    } // }}}

    // }}}

    // make_key_value_type_list_from_integer_sequence {{{

    { // 01 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 0, 1>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 0>
          , integral_pair<std::size_t, int, 1, 1>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 10 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 1, 0>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 1>
          , integral_pair<std::size_t, int, 1, 0>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 012 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 0, 1, 2>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 0>
          , integral_pair<std::size_t, int, 1, 1>
          , integral_pair<std::size_t, int, 2, 2>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 021 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 0, 2, 1>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 0>
          , integral_pair<std::size_t, int, 1, 2>
          , integral_pair<std::size_t, int, 2, 1>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 102 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 1, 0, 2>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 1>
          , integral_pair<std::size_t, int, 1, 0>
          , integral_pair<std::size_t, int, 2, 2>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 120 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 1, 2, 0>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 1>
          , integral_pair<std::size_t, int, 1, 2>
          , integral_pair<std::size_t, int, 2, 0>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 201 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 2, 0, 1>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 2>
          , integral_pair<std::size_t, int, 1, 0>
          , integral_pair<std::size_t, int, 2, 1>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 210 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 2, 1, 0>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 2>
          , integral_pair<std::size_t, int, 1, 1>
          , integral_pair<std::size_t, int, 2, 0>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 0123 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 0, 1, 2, 3>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 0>
          , integral_pair<std::size_t, int, 1, 1>
          , integral_pair<std::size_t, int, 2, 2>
          , integral_pair<std::size_t, int, 3, 3>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 3210 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 3, 2, 1, 0>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 3>
          , integral_pair<std::size_t, int, 1, 2>
          , integral_pair<std::size_t, int, 2, 1>
          , integral_pair<std::size_t, int, 3, 0>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 1320 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 1, 3, 2, 0>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 1>
          , integral_pair<std::size_t, int, 1, 3>
          , integral_pair<std::size_t, int, 2, 2>
          , integral_pair<std::size_t, int, 3, 0>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    // }}} 

    // make_integer_sequence_inverse_mapping {{{

    { // 01 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 0, 1>
        >::type;

        using B = integer_sequence<std::size_t, 0, 1>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 10 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 1, 0>
        >::type;

        using B = integer_sequence<std::size_t, 1, 0>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 012 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 0, 1, 2>
        >::type;

        using B = integer_sequence<std::size_t, 0, 1, 2>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 021 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 0, 2, 1>
        >::type;

        using B = integer_sequence<std::size_t, 0, 2, 1>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 102 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 1, 0, 2>
        >::type;

        using B = integer_sequence<std::size_t, 1, 0, 2>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 120 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 1, 2, 0>
        >::type;

        using B = integer_sequence<std::size_t, 2, 0, 1>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 201 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 2, 0, 1>
        >::type;

        using B = integer_sequence<std::size_t, 1, 2, 0>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 210 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 2, 1, 0>
        >::type;

        using B = integer_sequence<std::size_t, 2, 1, 0>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 0123 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 0, 1, 2, 3>
        >::type;

        using B = integer_sequence<std::size_t, 0, 1, 2, 3>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 3210 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 3, 2, 1, 0>
        >::type;

        using B = integer_sequence<std::size_t, 3, 2, 1, 0>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 1320 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 1, 3, 2, 0>
        >::type;

        using B = integer_sequence<std::size_t, 3, 0, 2, 1>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    // }}}

    return boost::report_errors();
}